

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SliceDynamicLayerParams::SerializeWithCachedSizes
          (SliceDynamicLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<bool> *pRVar2;
  bool *pbVar3;
  int64 iVar4;
  int local_28;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SliceDynamicLayerParams *this_local;
  
  iVar1 = beginmasks_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_beginmasks_cached_byte_size_);
    pRVar2 = beginmasks(this);
    pbVar3 = google::protobuf::RepeatedField<bool>::data(pRVar2);
    iVar1 = beginmasks_size(this);
    google::protobuf::internal::WireFormatLite::WriteBoolArray(pbVar3,iVar1,output);
  }
  iVar1 = endids_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(3,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_endids_cached_byte_size_);
  }
  i_1 = 0;
  iVar1 = endids_size(this);
  for (; i_1 < iVar1; i_1 = i_1 + 1) {
    iVar4 = endids(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteInt64NoTag(iVar4,output);
  }
  iVar1 = endmasks_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(4,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_endmasks_cached_byte_size_)
    ;
    pRVar2 = endmasks(this);
    pbVar3 = google::protobuf::RepeatedField<bool>::data(pRVar2);
    iVar1 = endmasks_size(this);
    google::protobuf::internal::WireFormatLite::WriteBoolArray(pbVar3,iVar1,output);
  }
  iVar1 = strides_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(5,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_strides_cached_byte_size_);
  }
  local_28 = 0;
  iVar1 = strides_size(this);
  for (; local_28 < iVar1; local_28 = local_28 + 1) {
    iVar4 = strides(this,local_28);
    google::protobuf::internal::WireFormatLite::WriteInt64NoTag(iVar4,output);
  }
  iVar1 = squeezemasks_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(6,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_squeezemasks_cached_byte_size_);
    pRVar2 = squeezemasks(this);
    pbVar3 = google::protobuf::RepeatedField<bool>::data(pRVar2);
    iVar1 = squeezemasks_size(this);
    google::protobuf::internal::WireFormatLite::WriteBoolArray(pbVar3,iVar1,output);
  }
  return;
}

Assistant:

void SliceDynamicLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SliceDynamicLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated bool beginMasks = 2;
  if (this->beginmasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_beginmasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->beginmasks().data(), this->beginmasks_size(), output);
  }

  // repeated int64 endIds = 3;
  if (this->endids_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_endids_cached_byte_size_);
  }
  for (int i = 0, n = this->endids_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->endids(i), output);
  }

  // repeated bool endMasks = 4;
  if (this->endmasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(4, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_endmasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->endmasks().data(), this->endmasks_size(), output);
  }

  // repeated int64 strides = 5;
  if (this->strides_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(5, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_strides_cached_byte_size_);
  }
  for (int i = 0, n = this->strides_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->strides(i), output);
  }

  // repeated bool squeezeMasks = 6;
  if (this->squeezemasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(6, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_squeezemasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->squeezemasks().data(), this->squeezemasks_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SliceDynamicLayerParams)
}